

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

Variable __thiscall LiteScript::CreateVariable(LiteScript *this,Memory *memory,int value)

{
  Object *pOVar1;
  uint *extraout_RDX;
  Variable VVar2;
  Number local_20;
  
  Memory::Create((Memory *)this,(Type *)memory);
  Number::Number(&local_20,value);
  pOVar1 = Variable::operator->((Variable *)this);
  Number::operator=((Number *)pOVar1->data,&local_20);
  VVar2.nb_ref = extraout_RDX;
  VVar2.obj = (Object *)this;
  return VVar2;
}

Assistant:

LiteScript::Variable LiteScript::CreateVariable(Memory &memory, int value) {
    Variable v = memory.Create(Type::NUMBER);
    v->GetData<Number>() = Number(value);
    return v;
}